

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O2

void __thiscall SkipList::Remove(SkipList *this,int inKey)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *nodeCopy;
  
  pNVar3 = Find(this,inKey);
  if (pNVar3 != (Node *)0x0) {
    if (pNVar3->top != (Node *)0x0) {
      __assert_fail("(node->top == nullptr) && \"Found node is not at the top level!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_3_data_and_algorithms/ch_18/p3ch18ex11.cpp"
                    ,0xe6,"void SkipList::Remove(int)");
    }
    if (1 < pNVar3->key + 0x80000001U) {
      while (pNVar3 != (Node *)0x0) {
        pNVar1 = pNVar3->prev;
        pNVar2 = pNVar3->next;
        pNVar1->next = pNVar2;
        pNVar2->prev = pNVar1;
        pNVar1 = pNVar3->bot;
        std::__cxx11::string::~string((string *)&pNVar3->val);
        operator_delete(pNVar3,0x48);
        pNVar3 = pNVar1;
      }
      this->size = this->size + -1;
    }
  }
  return;
}

Assistant:

void SkipList::Remove(int inKey)
{
	Node* node = Find(inKey);
	if (node)
	{
		assert((node->top == nullptr) && "Found node is not at the top level!");
		if (node->key == TRAILER_KEY || node->key == HEADER_KEY)
		{
			return;
		}
		while(node)
		{
			Node* nodeCopy = node;
			node->prev->next = node->next;
			node->next->prev = node->prev;
			node = node->bot;
			delete nodeCopy;
		}
		--size;
	}
}